

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1L1Q1P<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,
          Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *Pi,
          Matrix<float,_4,_1,_0,_4,_1> *Pi_B)

{
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this;
  type rhs;
  ReturnType_conflict RVar1;
  RealScalar RVar2;
  float fVar3;
  float fVar4;
  Matrix<float,_3,_1,_0,_3,_1> local_308;
  DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *local_2f8;
  Matrix<float,_3,_1,_0,_3,_1> v3;
  undefined8 local_2d8;
  float local_2d0;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_4,_1,_0,_4,_1> Pi_B1;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_270;
  Matrix<float,_3,_1,_0,_3,_1> t2;
  Matrix<float,_3,_1,_0,_3,_1> t1;
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi_B;
  Matrix<float,_4,_1,_0,_4,_1> Pi_1;
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  
  local_2f8 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi_B;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV_B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TP,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi,3);
  RVar1 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                     &transV_B,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *
                     )&TP);
  Pi_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       RVar1 + (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
               array[3];
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TP_B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                    *)&transU_B,(float *)&Pi_B1,(StorageBaseType *)&TP_B);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transV,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU_B);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Pi_1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P1_pi,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>const>>
            ((Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Pi_1,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU);
  P1_pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV_B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1_B,3);
  this = local_2f8;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)&TP,local_2f8,3);
  RVar1 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                     &transV_B,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *
                     )&TP);
  Pi_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       RVar1 + *(float *)(this + 0xc);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>((Type *)&TP_B,this,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                    *)&transU_B,(float *)&Pi_B1,(StorageBaseType *)&TP_B);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&transV,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU_B);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Pi_1,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P1_pi_B,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>const>>
            ((Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Pi_1,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU);
  P1_pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       1.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transU,4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV_B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P1_pi,3);
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xb];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [6];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [7];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [3];
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)&TP,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&transU,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
              *)&transV);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transU_B,4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&transV_B,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P1_pi_B,3);
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xb];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [6];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [7];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [2];
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [3];
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)&TP,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transU_B,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
              *)&transV);
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &transU;
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
       Pi;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
            (&Pi_1,(Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
                    *)&transV);
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
       local_2f8;
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transU_B;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
            (&Pi_B1,(Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
                     *)&transV);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transV,4,4);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&transV_B,4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&t1);
  t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&t2);
  t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TP,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Pi_1,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            ((PlainObject *)&TP_B,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TP);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,_1,1,0,4,1>>
            (&v3,(Matrix<float,__1,_1,_0,_4,_1> *)&TP_B);
  fVar3 = v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  fVar4 = v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       fVar4 - t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2] * fVar3;
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] -
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       fVar4;
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       fVar3 - v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[1];
  local_2d0 = t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar3 -
              v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
  local_2d8 = CONCAT44(v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar4,
                       fVar4 * t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1] -
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar3);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_308);
  local_2f8 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)CONCAT44(local_2f8._4_4_,RVar2);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_2d8);
  if (RVar2 <= local_2f8._0_4_) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP);
  }
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_308,(Matrix<float,_3,_1,_0,_3,_1> *)&TP);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &local_308;
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&TP,&transV,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP_B);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] - local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[0] *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2] -
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] -
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_270.m_lhs = &TP_B;
  Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,&transV,1,0,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_270);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &v3;
  Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,&transV,2,0,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP_B);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&TP,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Pi_B1,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            ((PlainObject *)&TP_B,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)&TP);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,_1,1,0,4,1>>
            (&v3,(Matrix<float,__1,_1,_0,_4,_1> *)&TP_B);
  fVar3 = v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  fVar4 = v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
       fVar4 - t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2] * fVar3;
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] -
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       fVar4;
  local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       fVar3 - v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[1];
  local_2d0 = t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar3 -
              v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
  local_2d8 = CONCAT44(v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar4,
                       fVar4 * t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1] -
                       t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar3);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_308);
  local_2f8 = (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)CONCAT44(local_2f8._4_4_,RVar2);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_2d8);
  if (RVar2 <= local_2f8._0_4_) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP);
  }
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_308,(Matrix<float,_3,_1,_0,_3,_1> *)&TP);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &local_308;
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)&TP,&transV_B,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP_B);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1] - local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[0] *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2] -
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] -
       v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       local_308.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_270.m_lhs = &TP_B;
  Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,&transV_B,1,0,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_270);
  TP_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &v3;
  Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,&transV_B,2,0,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TP,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TP_B);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_270.m_lhs = &transV;
  local_270.m_rhs = &transU;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            (&TP,&local_270);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&TP);
  local_270.m_rhs = &transU_B;
  local_270.m_lhs = &transV_B;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            (&TP_B,&local_270);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&TP_B);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}